

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

wstring * ON_UTF_std_string_to_std_wstring
                    (wstring *__return_storage_ptr__,int bTestByteOrder,string *sInputUTF,
                    int sInputUTF_count,uint *error_status,uint error_mask,
                    ON__UINT32 error_code_point,int *end_element_index)

{
  wstring local_70;
  char *local_50;
  char *sEndElement;
  char *sInputUTFc_str;
  undefined1 local_35;
  int sUTF8_length;
  uint *puStack_30;
  uint error_mask_local;
  uint *error_status_local;
  string *psStack_20;
  int sInputUTF_count_local;
  string *sInputUTF_local;
  wstring *pwStack_10;
  int bTestByteOrder_local;
  wstring *str;
  
  local_35 = 0;
  sUTF8_length = error_mask;
  puStack_30 = error_status;
  error_status_local._4_4_ = sInputUTF_count;
  psStack_20 = sInputUTF;
  sInputUTF_local._4_4_ = bTestByteOrder;
  pwStack_10 = __return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  sInputUTFc_str._4_4_ = std::__cxx11::string::length();
  if (sInputUTFc_str._4_4_ < error_status_local._4_4_) {
    if (end_element_index != (int *)0x0) {
      *end_element_index = 0;
    }
    if (puStack_30 != (uint *)0x0) {
      *puStack_30 = 1;
    }
  }
  else {
    if (error_status_local._4_4_ == -1) {
      error_status_local._4_4_ = sInputUTFc_str._4_4_;
    }
    local_50 = (char *)std::__cxx11::string::c_str();
    sEndElement = local_50;
    ON_UTF8_to_std_wstring_abi_cxx11_
              (&local_70,sInputUTF_local._4_4_,local_50,error_status_local._4_4_,puStack_30,
               sUTF8_length,error_code_point,&local_50);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_70);
    std::__cxx11::wstring::~wstring((wstring *)&local_70);
    if (end_element_index != (int *)0x0) {
      *end_element_index = (int)local_50 - (int)sEndElement;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_UTF_std_string_to_std_wstring(
  int bTestByteOrder,
  const std::string& sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::wstring str;
  
  const int sUTF8_length = static_cast<int>(sInputUTF.length());

  if ( sInputUTF_count > sUTF8_length )
  {
    if ( 0 != end_element_index )
      *end_element_index = 0;
    if ( 0 != error_status )
      *error_status = 1;
    return str;
  }
  
  if ( -1 == sInputUTF_count )
    sInputUTF_count = sUTF8_length;

  const char* sInputUTFc_str = sInputUTF.c_str();
  const char* sEndElement = sInputUTFc_str;
  str = ON_UTF8_to_std_wstring(
    bTestByteOrder,
    sInputUTFc_str,
    sInputUTF_count,
    error_status,
    error_mask,
    error_code_point,
    &sEndElement
    );

  if ( 0 != end_element_index )
    *end_element_index = static_cast<int>(sEndElement - sInputUTFc_str);

  return str;
}